

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  SyntaxFactory *this_00;
  BumpAllocator *alloc;
  bool bVar1;
  TokenKind endKind;
  SyntaxKind SVar2;
  int iVar3;
  HierarchyInstantiationSyntax *pHVar4;
  PortDeclarationSyntax *pPVar5;
  MemberSyntax *pMVar6;
  DPIExportSyntax *pDVar7;
  StatementSyntax *pSVar8;
  ProceduralBlockSyntax *pPVar9;
  UdpDeclarationSyntax *pUVar10;
  CheckerInstantiationSyntax *pCVar11;
  SequenceDeclarationSyntax *pSVar12;
  ImmediateAssertionMemberSyntax *pIVar13;
  ModuleDeclarationSyntax *pMVar14;
  TimeUnitsDeclarationSyntax *pTVar15;
  PropertyDeclarationSyntax *pPVar16;
  DPIImportSyntax *pDVar17;
  IfGenerateSyntax *pIVar18;
  GenvarDeclarationSyntax *pGVar19;
  GenerateRegionSyntax *pGVar20;
  LoopGenerateSyntax *pLVar21;
  ConfigDeclarationSyntax *pCVar22;
  BindDirectiveSyntax *pBVar23;
  CaseGenerateSyntax *pCVar24;
  CheckerDeclarationSyntax *pCVar25;
  ContinuousAssignSyntax *pCVar26;
  DefParamSyntax *pDVar27;
  NetAliasSyntax *pNVar28;
  CovergroupDeclarationSyntax *pCVar29;
  ModportDeclarationSyntax *pMVar30;
  ClassDeclarationSyntax *pCVar31;
  DataDeclarationSyntax *data;
  CheckerDataDeclarationSyntax *pCVar32;
  SpecifyBlockSyntax *pSVar33;
  ConcurrentAssertionStatementSyntax *pCVar34;
  ConcurrentAssertionMemberSyntax *pCVar35;
  SpecparamDeclarationSyntax *pSVar36;
  ElabSystemTaskSyntax *pEVar37;
  PrimitiveInstantiationSyntax *pPVar38;
  FunctionDeclarationSyntax *pFVar39;
  NamedLabelSyntax *label;
  ImmediateAssertionStatementSyntax *pIVar40;
  SourceLocation SVar41;
  EmptyMemberSyntax *pEVar42;
  PackageImportDeclarationSyntax *pPVar43;
  Diagnostic *this_01;
  undefined4 extraout_var;
  uint uVar44;
  size_type sVar45;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_03;
  TokenKind TVar46;
  anon_class_8_1_8991fb9c *in_R8;
  uint32_t offset;
  AttrList attributes;
  Token TVar47;
  SourceRange SVar48;
  Token name;
  Token colon;
  Token TVar49;
  string_view arg;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  Token token;
  Token endgenerate;
  SmallVector<slang::parsing::Token,_4UL> quals;
  SyntaxFactory *local_f0;
  Token local_e8;
  Token local_d8;
  undefined1 local_c8 [32];
  AttrList local_a8;
  TokenList local_70;
  Token local_40;
  
  attributes = parseAttributes(this);
  sVar45 = attributes.size_;
  bVar1 = isHierarchyInstantiation(this,false);
  if (bVar1) {
    pHVar4 = parseHierarchyInstantiation(this,attributes);
    return &pHVar4->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration(this,false);
  if (bVar1) {
    pPVar5 = parsePortDeclaration(this,attributes);
    return &pPVar5->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration(this);
  if (bVar1) {
    pMVar6 = parseNetDeclaration(this,attributes);
    return pMVar6;
  }
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
LAB_0033ba1d:
    pMVar6 = parseVariableDeclaration(this,attributes);
    return pMVar6;
  }
  local_e8 = ParserBase::peek(&this->super_ParserBase);
  uVar44 = local_e8._0_4_ & 0xffff;
  TVar46 = local_e8.kind;
  if (0xa5 < uVar44) {
    if (uVar44 < 0xe9) {
      if (uVar44 < 0xc1) {
        SVar2 = 0x42d928;
        switch(uVar44) {
        case 0xa6:
          TVar47 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar47.kind == StringLiteral) {
            pDVar7 = parseDPIExport(this,attributes);
            return &pDVar7->super_MemberSyntax;
          }
          pMVar6 = parseExportDeclaration(this,attributes);
          return pMVar6;
        case 0xa8:
          errorIfAttributes(this,attributes);
          pEVar37 = (ElabSystemTaskSyntax *)parseExternMember(this,parentKind,attributes);
          goto LAB_0033c42c;
        case 0xa9:
          goto switchD_0033ba8e_caseD_a9;
        case 0xab:
          pLVar21 = parseLoopGenerateConstruct(this,attributes);
          return &pLVar21->super_MemberSyntax;
        case 0xb1:
          SVar2 = FunctionDeclaration;
          TVar46 = EndFunctionKeyword;
LAB_0033c04f:
          pFVar39 = parseFunctionDeclaration(this,attributes,SVar2,TVar46,parentKind);
          return &pFVar39->super_MemberSyntax;
        case 0xb2:
          errorIfAttributes(this,attributes);
          TVar47 = ParserBase::consume(&this->super_ParserBase);
          Token::Token(&local_d8);
          local_c8._0_8_ = this;
          local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
               (span<slang::parsing::Token,_18446744073709551615UL>)
               parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
                         (this,(TokenKind)&local_d8,(Token *)local_c8,SVar2,in_R8);
          local_70.super_SyntaxListBase.childCount =
               local_70.super_span<slang::parsing::Token,_18446744073709551615UL>.size_;
          local_c8._8_8_ = (SyntaxNode *)0x0;
          local_c8._16_4_ = SyntaxList;
          local_c8._0_8_ = &PTR_getChild_00508348;
          local_70.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
          local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x50b010);
          local_c8._24_8_ = sVar45;
          local_a8 = attributes;
          pGVar20 = slang::syntax::SyntaxFactory::generateRegion
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar47
                               ,(SyntaxList<slang::syntax::MemberSyntax> *)&local_70,local_d8);
          return &pGVar20->super_MemberSyntax;
        case 0xb3:
          pGVar19 = parseGenvarDeclaration(this,attributes);
          return &pGVar19->super_MemberSyntax;
        case 0xb4:
          goto switchD_0033ba8e_caseD_b4;
        case 0xb7:
          pIVar18 = parseIfGenerateConstruct(this,attributes);
          return &pIVar18->super_MemberSyntax;
        case 0xbe:
          TVar47 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar47.kind == StringLiteral) {
            pDVar17 = parseDPIImport(this,attributes);
            return &pDVar17->super_MemberSyntax;
          }
          pPVar43 = parseImportDeclaration(this,attributes);
          return &pPVar43->super_MemberSyntax;
        }
      }
      else if (uVar44 < 0xd6) {
        if (uVar44 == 0xc1) {
          TVar49 = ParserBase::consume(&this->super_ParserBase);
          SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar49.kind);
          bVar1 = true;
          goto LAB_0033bb43;
        }
        if (uVar44 == 0xc9) {
          TVar47 = ParserBase::peek(&this->super_ParserBase,1);
          if (TVar47.kind == ClassKeyword) goto LAB_0033c2d5;
          goto switchD_0033bb98_caseD_e9;
        }
      }
      else {
        if (uVar44 == 0xd6) {
switchD_0033bb98_caseD_e9:
          pMVar14 = parseModule(this,attributes,parentKind,anyLocalModules);
          return &pMVar14->super_MemberSyntax;
        }
        if (uVar44 == 0xd9) {
          pMVar30 = parseModportDeclaration(this,attributes);
          return &pMVar30->super_MemberSyntax;
        }
        if (uVar44 == 0xda) goto switchD_0033bb98_caseD_e9;
      }
    }
    else if (uVar44 < 0x11b) {
      if (uVar44 < 0xfa) {
        switch(uVar44) {
        case 0xe9:
        case 0xf0:
          goto switchD_0033bb98_caseD_e9;
        case 0xee:
          pUVar10 = parseUdpDeclaration(this,attributes);
          return &pUVar10->super_MemberSyntax;
        case 0xf1:
          pPVar16 = parsePropertyDeclaration(this,attributes);
          return &pPVar16->super_MemberSyntax;
        }
      }
      else {
        if (uVar44 == 0xfa) {
          TVar47 = ParserBase::consume(&this->super_ParserBase);
          local_c8._8_8_ = (SyntaxNode *)0x0;
          local_c8._16_4_ = SyntaxList;
          local_c8._0_8_ = &PTR_getChild_00508348;
          local_c8._24_8_ = sVar45;
          local_a8 = attributes;
          data = parseDataDeclaration(this,(AttrList)ZEXT816(0));
          pCVar32 = slang::syntax::SyntaxFactory::checkerDataDeclaration
                              (&this->factory,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar47
                               ,data);
          return &pCVar32->super_MemberSyntax;
        }
        if (uVar44 == 0x106) {
          pCVar34 = parseConcurrentAssertion(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
          goto LAB_0033c3ac;
        }
        if (uVar44 == 0x113) {
          pSVar12 = parseSequenceDeclaration(this,attributes);
          return &pSVar12->super_MemberSyntax;
        }
      }
    }
    else if (uVar44 < 0x12e) {
      if (uVar44 == 0x11b) {
        errorIfAttributes(this,attributes);
        pSVar33 = parseSpecifyBlock(this,attributes);
        return &pSVar33->super_MemberSyntax;
      }
      if (uVar44 == 0x11c) {
        pSVar36 = parseSpecparam(this,attributes);
        return &pSVar36->super_MemberSyntax;
      }
      if (uVar44 == 0x12a) {
        SVar2 = TaskDeclaration;
        TVar46 = EndTaskKeyword;
        goto LAB_0033c04f;
      }
    }
    else {
      if (uVar44 - 0x12e < 2) {
        errorIfAttributes(this,attributes);
        pTVar15 = parseTimeUnitsDeclaration(this,attributes);
        return &pTVar15->super_MemberSyntax;
      }
      if (uVar44 == 0x146) {
        TVar47 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar47.kind == ClassKeyword) {
LAB_0033c2d5:
          TVar47 = ParserBase::consume(&this->super_ParserBase);
          pCVar31 = parseClassDeclaration(this,attributes,TVar47);
          return &pCVar31->super_MemberSyntax;
        }
      }
      else if (uVar44 == 0x156) {
        TVar47 = ParserBase::peek(&this->super_ParserBase,1);
        if (((TVar47.kind == DoubleColon) &&
            (TVar47 = ParserBase::peek(&this->super_ParserBase,2), TVar47.kind == Identifier)) &&
           (TVar47 = ParserBase::peek(&this->super_ParserBase,3), TVar47.kind == Identifier)) {
          pCVar11 = parseCheckerInstantiation(this,attributes);
          return &pCVar11->super_MemberSyntax;
        }
        goto LAB_0033ba1d;
      }
    }
    goto switchD_0033ba8e_caseD_a7;
  }
  if (uVar44 < 0x5f) {
    if (uVar44 == 2) {
      TVar47 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar47.kind == Colon) {
        TVar47 = ParserBase::peek(&this->super_ParserBase,2);
        uVar44 = TVar47.kind - 0x65;
        if ((uVar44 < 0x1e) && ((0x20000005U >> (uVar44 & 0x1f) & 1) != 0)) {
          name = ParserBase::consume(&this->super_ParserBase);
          this_00 = &this->factory;
          colon = ParserBase::expect(&this->super_ParserBase,Colon);
          label = slang::syntax::SyntaxFactory::namedLabel(this_00,name,colon);
          pSVar8 = parseAssertionStatement(this,label,(AttrList)ZEXT816(0));
          uVar44 = (pSVar8->super_SyntaxNode).kind - ImmediateAssertStatement;
          if ((uVar44 < 4) && (uVar44 != 1)) {
            local_c8._8_8_ = (SyntaxNode *)0x0;
            local_c8._16_4_ = SyntaxList;
            local_c8._0_8_ = &PTR_getChild_00508348;
            local_c8._24_8_ = sVar45;
            local_a8 = attributes;
            pIVar40 = slang::syntax::SyntaxNode::
                      as<slang::syntax::ImmediateAssertionStatementSyntax>
                                (&pSVar8->super_SyntaxNode);
            anyLocalModules =
                 (bool *)slang::syntax::SyntaxFactory::immediateAssertionMember
                                   (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                            local_c8,pIVar40);
          }
          else {
            local_c8._8_8_ = (SyntaxNode *)0x0;
            local_c8._16_4_ = SyntaxList;
            local_c8._0_8_ = &PTR_getChild_00508348;
            local_c8._24_8_ = sVar45;
            local_a8 = attributes;
            pCVar34 = slang::syntax::SyntaxNode::
                      as<slang::syntax::ConcurrentAssertionStatementSyntax>
                                (&pSVar8->super_SyntaxNode);
            anyLocalModules =
                 (bool *)slang::syntax::SyntaxFactory::concurrentAssertionMember
                                   (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                            local_c8,pCVar34);
          }
        }
        uVar44 = (TVar47._0_4_ & 0xffff) - 0x65;
        if ((uVar44 < 0x1e) && ((0x20000005U >> (uVar44 & 0x1f) & 1) != 0)) {
          return &((ConcurrentAssertionMemberSyntax *)anyLocalModules)->super_MemberSyntax;
        }
      }
      TVar47 = ParserBase::peek(&this->super_ParserBase,1);
      if ((TVar47.kind == Hash) ||
         (TVar47 = ParserBase::peek(&this->super_ParserBase,1), TVar47.kind == OpenParenthesis)) {
        pPVar38 = parsePrimitiveInstantiation(this,attributes);
        return &pPVar38->super_MemberSyntax;
      }
      TVar47 = ParserBase::peek(&this->super_ParserBase,1);
      if (((TVar47.kind == DoubleColon) &&
          (TVar47 = ParserBase::peek(&this->super_ParserBase,2), TVar47.kind == Identifier)) &&
         (TVar47 = ParserBase::peek(&this->super_ParserBase,3), TVar47.kind == Identifier)) {
        pCVar11 = parseCheckerInstantiation(this,attributes);
        return &pCVar11->super_MemberSyntax;
      }
      pMVar6 = parseVariableDeclaration(this,attributes);
      return pMVar6;
    }
    if (uVar44 == 3) {
      pEVar37 = parseElabSystemTask(this,attributes);
LAB_0033c42c:
      if (pEVar37 != (ElabSystemTaskSyntax *)0x0) {
        return &pEVar37->super_MemberSyntax;
      }
    }
    else if (uVar44 == 0x15) {
      local_c8._8_8_ = (SyntaxNode *)0x0;
      local_c8._16_4_ = SyntaxList;
      local_c8._0_8_ = &PTR_getChild_00508348;
      local_70.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
      local_70.super_SyntaxListBase.childCount = 0;
      local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
           (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
      local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x507e50);
      local_c8._24_8_ = sVar45;
      local_a8 = attributes;
      TVar49 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_0033c6b3;
    }
    goto switchD_0033ba8e_caseD_a7;
  }
  switch(uVar44) {
  case 0x5f:
    pNVar28 = parseNetAlias(this,attributes);
    return &pNVar28->super_MemberSyntax;
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
switchD_0033ba8e_caseD_a9:
    TVar49 = ParserBase::consume(&this->super_ParserBase);
    SVar2 = slang::syntax::SyntaxFacts::getProceduralBlockKind(TVar49.kind);
    bVar1 = false;
LAB_0033bb43:
    local_c8._16_4_ = SyntaxList;
    local_f0 = &this->factory;
    local_c8._8_8_ = (SyntaxNode *)0x0;
    local_c8._0_8_ = &PTR_getChild_00508348;
    local_c8._24_8_ = sVar45;
    local_a8 = attributes;
    pSVar8 = parseStatement(this,bVar1,false);
    pPVar9 = slang::syntax::SyntaxFactory::proceduralBlock
                       (local_f0,SVar2,
                        (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,TVar49,pSVar8
                       );
    return &pPVar9->super_MemberSyntax;
  case 0x65:
  case 0x67:
  case 0x82:
    pCVar34 = (ConcurrentAssertionStatementSyntax *)
              parseAssertionStatement(this,(NamedLabelSyntax *)0x0,(AttrList)ZEXT816(0));
    uVar44 = (pCVar34->super_StatementSyntax).super_SyntaxNode.kind - ImmediateAssertStatement;
    if ((uVar44 < 4) && (uVar44 != 1)) {
      local_c8._8_8_ = (SyntaxNode *)0x0;
      local_c8._16_4_ = SyntaxList;
      local_c8._0_8_ = &PTR_getChild_00508348;
      local_c8._24_8_ = sVar45;
      local_a8 = attributes;
      pIVar40 = slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                          ((SyntaxNode *)pCVar34);
      pIVar13 = slang::syntax::SyntaxFactory::immediateAssertionMember
                          (&this->factory,
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,pIVar40);
      return &pIVar13->super_MemberSyntax;
    }
LAB_0033c3ac:
    local_c8._8_8_ = (SyntaxNode *)0x0;
    local_c8._16_4_ = SyntaxList;
    local_c8._0_8_ = &PTR_getChild_00508348;
    local_c8._24_8_ = sVar45;
    local_a8 = attributes;
    pCVar34 = slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                        ((SyntaxNode *)pCVar34);
    pCVar35 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                        (&this->factory,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8,pCVar34);
    return &pCVar35->super_MemberSyntax;
  case 0x66:
    pCVar26 = parseContinuousAssign(this,attributes);
    return &pCVar26->super_MemberSyntax;
  case 0x6a:
    errorIfAttributes(this,attributes);
    if (sVar45 == 0) {
      SVar41 = Token::location(&local_e8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x940005,SVar41);
      pMVar6 = parseGenerateBlock(this);
      return pMVar6;
    }
    break;
  case 0x6b:
    pBVar23 = parseBindDirective(this,attributes);
    return &pBVar23->super_MemberSyntax;
  case 0x74:
    pCVar24 = parseCaseGenerateConstruct(this,attributes);
    return &pCVar24->super_MemberSyntax;
  case 0x79:
    pCVar25 = parseCheckerDeclaration(this,attributes);
    return &pCVar25->super_MemberSyntax;
  case 0x7a:
    Token::Token(&local_40);
    pCVar31 = parseClassDeclaration(this,attributes,local_40);
    return &pCVar31->super_MemberSyntax;
  case 0x7b:
    goto switchD_0033bae9_caseD_7b;
  case 0x7d:
    errorIfAttributes(this,attributes);
    pCVar22 = parseConfigDeclaration(this,attributes);
    return &pCVar22->super_MemberSyntax;
  case 0x7f:
    pMVar6 = parseConstraint(this,attributes,
                             (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0));
    return pMVar6;
  case 0x83:
    pCVar29 = parseCovergroupDeclaration(this,attributes);
    return &pCVar29->super_MemberSyntax;
  case 0x87:
switchD_0033ba8e_caseD_b4:
    TVar47 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar47.kind == ClockingKeyword) {
switchD_0033bae9_caseD_7b:
      pMVar6 = parseClockingDeclaration(this,attributes);
      return pMVar6;
    }
    TVar47 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar46 == DefaultKeyword && TVar47.kind == DisableKeyword) {
      pMVar6 = parseDefaultDisable(this,attributes);
      return pMVar6;
    }
  default:
switchD_0033ba8e_caseD_a7:
    bVar1 = slang::syntax::SyntaxFacts::isGateType(TVar46);
    if (bVar1) {
      pPVar38 = parsePrimitiveInstantiation(this,attributes);
      return &pPVar38->super_MemberSyntax;
    }
    bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(TVar46);
    if (bVar1) {
      Token::Token((Token *)&local_70);
      offset = 0;
      do {
        offset = offset + 1;
        local_70.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,offset);
        bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier
                          ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase);
      } while (bVar1);
      if ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == ConstraintKeyword) {
        local_c8._0_8_ = local_c8 + 0x18;
        local_c8._8_8_ = (SyntaxNode *)0x0;
        local_c8._16_8_ = 4;
        src = extraout_RDX;
        if (offset != 0) {
          do {
            local_d8 = ParserBase::consume(&this->super_ParserBase);
            SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                      ((SmallVectorBase<slang::parsing::Token> *)local_c8,&local_d8);
            src = extraout_RDX_00;
            if ((local_d8.kind != StaticKeyword) &&
               (bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(local_d8.kind),
               src = extraout_RDX_01, bVar1)) {
              SVar48 = Token::range(&local_d8);
              this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x60005,SVar48);
              arg = Token::valueText(&local_d8);
              Diagnostic::operator<<(this_01,arg);
              src = extraout_RDX_02;
            }
            offset = offset - 1;
          } while (offset != 0);
        }
        iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                          ((SmallVectorBase<slang::parsing::Token> *)local_c8,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
        qualifiers.data_._4_4_ = extraout_var;
        qualifiers.data_._0_4_ = iVar3;
        qualifiers.size_ = extraout_RDX_03;
        pMVar6 = parseConstraint(this,attributes,qualifiers);
        if ((pointer)local_c8._0_8_ == (pointer)(local_c8 + 0x18)) {
          return pMVar6;
        }
        free((void *)local_c8._0_8_);
        return pMVar6;
      }
      if (((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == TaskKeyword) ||
         ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword)) {
        SVar48 = Token::range(&local_e8);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7e0005,SVar48);
        for (; offset != 0; offset = offset - 1) {
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
        }
        SVar2 = TaskDeclaration;
        if ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase == FunctionKeyword) {
          SVar2 = FunctionDeclaration;
        }
        endKind = slang::syntax::SyntaxFacts::getSkipToKind
                            ((TokenKind)local_70.super_SyntaxListBase._vptr_SyntaxListBase);
        pFVar39 = parseFunctionDeclaration(this,attributes,SVar2,endKind,parentKind);
        return &pFVar39->super_MemberSyntax;
      }
    }
    if (sVar45 == 0) {
      return (MemberSyntax *)0x0;
    }
    break;
  case 0x88:
    pDVar27 = parseDefParam(this,attributes);
    return &pDVar27->super_MemberSyntax;
  }
  local_c8._8_8_ = (SyntaxNode *)0x0;
  local_c8._16_4_ = SyntaxList;
  local_c8._0_8_ = &PTR_getChild_00508348;
  local_70.super_SyntaxListBase.super_SyntaxNode.kind = TokenList;
  local_70.super_SyntaxListBase.childCount = 0;
  local_70.super_span<slang::parsing::Token,_18446744073709551615UL> =
       (span<slang::parsing::Token,_18446744073709551615UL>)ZEXT816(0);
  local_70.super_SyntaxListBase._0_16_ = ZEXT816(0x507e50);
  alloc = (this->super_ParserBase).alloc;
  local_c8._24_8_ = sVar45;
  local_a8 = attributes;
  SVar41 = Token::location(&local_e8);
  TVar49 = Token::createMissing(alloc,Semicolon,SVar41);
LAB_0033c6b3:
  pEVar42 = slang::syntax::SyntaxFactory::emptyMember
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_c8
                       ,&local_70,TVar49);
  return &pEVar42->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {});
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc));
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}